

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O0

bool __thiscall cppnet::CppNetBase::Connection(CppNetBase *this,string *ip,uint16_t port)

{
  uint uVar1;
  pointer this_00;
  __shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  uint32_t index;
  uint16_t port_local;
  string *ip_local;
  CppNetBase *this_local;
  
  this_00 = std::unique_ptr<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>::
            operator->(&this->_random);
  uVar1 = RangeRandom::Random(this_00);
  this_01 = (__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
            ::operator[](&this->_dispatchers,(ulong)uVar1);
  this_02 = std::__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_01);
  Dispatcher::Connect(this_02,ip,port);
  return true;
}

Assistant:

bool CppNetBase::Connection(const std::string& ip, uint16_t port) {
    uint32_t index = _random->Random();
    _dispatchers[index]->Connect(ip, port);
    return true;
}